

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_CND(Context *ctx)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  size_t in_RDX;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char tmp [64];
  char acStack_158 [64];
  char local_118 [64];
  char local_d8 [64];
  char local_98 [64];
  char local_58 [72];
  
  make_ARB1_destarg_string(ctx,local_98,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_d8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_118,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,acStack_158,in_RCX);
  iVar1 = ctx->scratch_registers;
  iVar2 = iVar1 + 1;
  ctx->scratch_registers = iVar2;
  if (ctx->max_scratch_registers <= iVar1) {
    ctx->max_scratch_registers = iVar2;
  }
  snprintf(local_58,0x40,"scratch%d");
  output_line(ctx,"SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };",local_58,local_d8);
  output_line(ctx,"CMP%s, %s, %s, %s;",local_98,local_58,acStack_158,local_118);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_CND(Context *ctx)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
    char tmp[64]; allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));

    // CND compares against 0.5, but we need to compare against 0.0...
    //  ...subtract to make up the difference.
    output_line(ctx, "SUB %s, %s, { 0.5, 0.5, 0.5, 0.5 };", tmp, src0);
    // D3D tests (src0 >= 0.0), but ARB1 tests (src0 < 0.0) ... so just
    //  switch src1 and src2 to get the same results.
    output_line(ctx, "CMP%s, %s, %s, %s;", dst, tmp, src2, src1);
    emit_ARB1_dest_modifiers(ctx);
}